

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
* __thiscall
google::protobuf::internal::TailCallTableInfo::BuildFieldEntries
          (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           *__return_storage_ptr__,TailCallTableInfo *this,Descriptor *descriptor,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields,
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          *aux_entries)

{
  pointer *ppAVar1;
  byte bVar2;
  uint8_t uVar3;
  MessageOptions MVar4;
  uint32_t uVar5;
  iterator __position;
  OneofDescriptor *pOVar6;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 aVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  Utf8CheckMode UVar12;
  bool bVar13;
  ushort uVar14;
  CppStringType CVar15;
  undefined4 uVar16;
  EnumDescriptor *pEVar17;
  Descriptor *pDVar18;
  FieldDescriptor *pFVar19;
  pointer pAVar20;
  Nonnull<const_char_*> pcVar21;
  int line;
  iterator iVar22;
  pointer __n;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *pvVar23;
  pointer pFVar24;
  MessageOptions *pMVar25;
  ushort uVar26;
  MessageOptions *pMVar27;
  long lVar28;
  int32_t first;
  int32_t last;
  undefined1 local_80 [16];
  undefined4 uStack_70;
  uint uStack_6c;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *local_68;
  long local_60;
  unsigned_long local_58;
  Descriptor *local_50;
  MessageOptions *local_48;
  long local_40;
  int32_t local_34;
  
  pvVar23 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             *)ordered_fields.len_;
  __n = ordered_fields.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = descriptor;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::reserve(__return_storage_ptr__,(size_type)__n);
  local_48 = (MessageOptions *)((long)__n << 5);
  if (__n == (pointer)0x0) {
    local_58 = 0;
  }
  else {
    pMVar27 = (MessageOptions *)0x0;
    local_58 = 0;
    do {
      pFVar19 = *(FieldDescriptor **)(&pMVar27->is_lite + (long)&message_options->is_lite);
      if ((((pFVar19->type_ & 0xfe) == 10) &&
          ((((pFVar19->type_ != 0xb ||
             (bVar11 = FieldDescriptor::is_map_message_type(pFVar19), !bVar11)) &&
            ((pFVar19->options_->field_0)._impl_.weak_ == false)) &&
           ((bVar11 = anon_unknown_36::HasLazyRep
                                (pFVar19,(FieldOptions *)
                                         (ulong)*(uint *)(&pMVar27->is_lite +
                                                         (long)&message_options[8].is_lite)),
            !bVar11 && ((&message_options[9].uses_codegen)[(long)pMVar27] == false)))))) &&
         ((&pMVar27->is_lite)[(long)&message_options[10].is_lite] == true)) {
        local_58 = (local_58 + 1) -
                   (ulong)(*(float *)(&pMVar27->is_lite + (long)&message_options[6].is_lite) < 0.005
                          );
      }
      pMVar27 = pMVar27 + 0x10;
    } while (local_48 != pMVar27);
  }
  lVar28 = (long)(pvVar23->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar23->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ::resize(pvVar23,lVar28 + local_58);
  local_60 = lVar28;
  local_40 = lVar28;
  if (__n == (pointer)0x0) {
LAB_00430826:
    if (local_60 - local_40 == local_58) {
      return __return_storage_ptr__;
    }
    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                        (local_60 - local_40,local_58,
                         "subtable_aux_idx - subtable_aux_idx_begin == num_non_cold_subtables");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x38e,pcVar21);
LAB_00430c39:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_80)
    ;
  }
  local_48 = (MessageOptions *)(&message_options->is_lite + (long)&local_48->is_lite);
  pMVar27 = message_options + 0xe;
  local_68 = pvVar23;
LAB_0042fdbe:
  pFVar19 = *(FieldDescriptor **)(pMVar27 + -0xe);
  local_80._8_4_ = *(undefined4 *)(pMVar27 + -10);
  uStack_6c = uStack_6c & 0xffffff00;
  local_80._12_4_ = 0;
  uStack_70._0_2_ = 0;
  uStack_70._2_2_ = 0;
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_80._0_8_ = pFVar19;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>
              (__return_storage_ptr__,__position,(FieldEntryInfo *)local_80);
    pFVar24 = (__return_storage_ptr__->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    lVar28 = (ulong)uStack_6c << 0x20;
    (__position._M_current)->aux_idx = (short)lVar28;
    (__position._M_current)->type_card = (short)((ulong)lVar28 >> 0x10);
    (__position._M_current)->utf8_check_mode = (char)((ulong)lVar28 >> 0x20);
    *(int3 *)&(__position._M_current)->field_0x15 = (int3)((ulong)lVar28 >> 0x28);
    (__position._M_current)->field = pFVar19;
    (__position._M_current)->hasbit_idx = (int)(ulong)(uint)local_80._8_4_;
    (__position._M_current)->inlined_string_idx = (int)((ulong)(uint)local_80._8_4_ >> 0x20);
    pFVar24 = (__return_storage_ptr__->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    )._M_impl.super__Vector_impl_data._M_finish = pFVar24;
  }
  UVar12 = cpp::GetUtf8CheckMode(pFVar19,(bool)(local_50->super_SymbolBase).symbol_type_);
  pFVar24[-1].utf8_check_mode = UVar12;
  uVar26 = 0x10;
  if (pFVar24[-1].hasbit_idx < 0) {
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar26 = 0x20;
    if ((bVar2 & 0x20) == 0) {
      if ((pFVar19->field_0x3 & 1) == 0) {
        uVar26 = 0;
      }
      else {
        if ((bVar2 & 0x10) == 0) {
          line = 0xb63;
LAB_00430c4f:
          protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,line);
        }
        pOVar6 = (pFVar19->scope_).containing_oneof;
        if (pOVar6 == (OneofDescriptor *)0x0) {
          line = 0xb31;
          goto LAB_00430c4f;
        }
        uVar26 = 0x30;
        if ((pOVar6->field_count_ == 1) && ((pOVar6->fields_->field_0x1 & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_00430c39;
        }
      }
    }
  }
  uVar3 = pFVar19->type_;
  switch(uVar3) {
  case '\x01':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x18c3;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x18c3;
    }
    break;
  case '\x02':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x1883;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x1883;
    }
    break;
  case '\x03':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x10c1;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x10c1;
    }
    break;
  case '\x04':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x8c1;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x8c1;
    }
    break;
  case '\x05':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x1081;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x1081;
    }
    break;
  case '\x06':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x8c3;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x8c3;
    }
    break;
  case '\a':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x883;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x883;
    }
    break;
  case '\b':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 1;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 1;
    }
    break;
  case '\t':
    if (UVar12 == kNone) goto switchD_0042feb7_caseD_c;
    if (UVar12 == kVerify) {
      uVar26 = uVar26 | 0xa05;
    }
    else if (UVar12 == kStrict) {
      uVar26 = uVar26 | 0xc05;
    }
    goto LAB_00430361;
  case '\n':
    if (pMVar27[-5].uses_codegen == true) {
      uVar26 = uVar26 | 0x646;
    }
    else if (pMVar27[-4].is_lite == true) {
      uVar26 = uVar26 | 0x446;
    }
    else {
      uVar26 = uVar26 | 0x246;
    }
    goto LAB_00430351;
  case '\v':
    bVar11 = FieldDescriptor::is_map_message_type(pFVar19);
    if (bVar11) {
      uVar26 = uVar26 | 7;
    }
    else {
      bVar11 = anon_unknown_36::HasLazyRep(pFVar19,(FieldOptions *)(ulong)*(uint *)(pMVar27 + -6));
      if (bVar11) {
        MVar4 = pMVar27[-6];
        if ((MVar4 == (MessageOptions)0x200) || (MVar4 == (MessageOptions)0x400)) {
          uVar26 = uVar26 | (ushort)MVar4 | 0x86;
          goto LAB_00430351;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x292,
                   "options.lazy_opt == field_layout::kTvEager || options.lazy_opt == field_layout::kTvLazy"
                  );
        goto LAB_00430c39;
      }
      if (pMVar27[-5].uses_codegen == true) {
        uVar26 = uVar26 | 0x606;
      }
      else if (pMVar27[-4].is_lite == true) {
        uVar26 = uVar26 | 0x406;
      }
      else {
        uVar26 = uVar26 | 0x206;
      }
    }
    goto LAB_00430351;
  case '\f':
switchD_0042feb7_caseD_c:
    uVar26 = uVar26 | 0x805;
    goto LAB_00430361;
  case '\r':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x881;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x881;
    }
    break;
  case '\x0e':
    bVar11 = anon_unknown_36::TreatEnumAsInt(pFVar19);
    if (bVar11) {
      bVar2 = pFVar19->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 != bVar11) {
        pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar21);
        goto LAB_00430c39;
      }
      uVar14 = 0x1881;
      if ((bVar2 & 0x20) != 0) {
        bVar11 = FieldDescriptor::is_packed(pFVar19);
        uVar14 = bVar11 + 0x1881;
      }
    }
    else {
      pEVar17 = FieldDescriptor::enum_type(pFVar19);
      bVar11 = anon_unknown_36::GetEnumValidationRange(pEVar17,(int32_t *)local_80,&local_34);
      bVar13 = FieldDescriptor::is_repeated(pFVar19);
      if (bVar11) {
        uVar14 = 0x1e81;
        if (bVar13) {
          bVar11 = FieldDescriptor::is_packed(pFVar19);
          uVar14 = bVar11 + 0x1e81;
        }
      }
      else {
        uVar14 = 0x1c81;
        if (bVar13) {
          bVar11 = FieldDescriptor::is_packed(pFVar19);
          uVar14 = bVar11 + 0x1c81;
        }
      }
    }
    break;
  case '\x0f':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x1083;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x1083;
    }
    break;
  case '\x10':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x10c3;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x10c3;
    }
    break;
  case '\x11':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x1281;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x1281;
    }
    break;
  case '\x12':
    bVar2 = pFVar19->field_0x1;
    bVar11 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 != bVar11) {
      pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar11,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar21);
      goto LAB_00430c39;
    }
    uVar14 = 0x12c1;
    if ((bVar2 & 0x20) != 0) {
      bVar11 = FieldDescriptor::is_packed(pFVar19);
      uVar14 = bVar11 + 0x12c1;
    }
    break;
  default:
    goto switchD_0042feb7_default;
  }
  uVar26 = uVar14 | uVar26;
LAB_00430351:
  uVar3 = pFVar19->type_;
switchD_0042feb7_default:
  if ((uVar3 == '\f') || (uVar3 == '\t')) {
LAB_00430361:
    CVar15 = FieldDescriptor::cpp_string_type(pFVar19);
    if ((CVar15 == kView) || (CVar15 == kString)) {
      bVar2 = pFVar19->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 != bVar11) {
        pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar21);
        goto LAB_00430c39;
      }
      if ((bVar2 & 0x20) == 0) {
        uVar14 = 0;
        if (pMVar27->is_lite != false) {
          uVar14 = 0x140;
        }
        uVar26 = uVar26 | uVar14;
      }
      else {
        uVar26 = uVar26 | 0x100;
      }
    }
    else if (CVar15 == kCord) {
      uVar26 = uVar26 | 0x80;
    }
  }
  uVar9 = local_80._12_4_;
  uVar16 = local_80._8_4_;
  uVar14 = uVar26 | 8;
  if (pMVar27[-4].uses_codegen == false) {
    uVar14 = uVar26;
  }
  pFVar24[-1].type_card = uVar14;
  uVar3 = pFVar19->type_;
  local_80._8_4_ = SUB84(pFVar19,0);
  uVar8 = local_80._8_4_;
  local_80._12_4_ = (undefined4)((ulong)pFVar19 >> 0x20);
  uVar10 = local_80._12_4_;
  local_80._8_4_ = uVar16;
  local_80._12_4_ = uVar9;
  if (uVar3 == '\n') {
LAB_00430434:
    if ((pFVar19->options_->field_0)._impl_.weak_ == true) {
      pFVar24[-1].type_card = 0;
    }
    else {
      bVar11 = anon_unknown_36::HasLazyRep(pFVar19,(FieldOptions *)(ulong)*(uint *)(pMVar27 + -6));
      pvVar23 = local_68;
      if (bVar11) {
        if (local_50->field_0x1 == '\x01') {
          iVar22._M_current =
               (local_68->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pFVar24[-1].aux_idx =
               (uint16_t)
               ((uint)((int)iVar22._M_current -
                      *(int *)&(local_68->
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_80._0_4_ = 4;
          if (iVar22._M_current ==
              (local_68->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80._8_4_ = uVar8;
            local_80._12_4_ = uVar10;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_68,iVar22,(AuxEntry *)local_80);
          }
          else {
            *(undefined8 *)iVar22._M_current = local_80._0_8_;
            ((iVar22._M_current)->field_1).field = pFVar19;
            ppAVar1 = &(local_68->
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          if (pMVar27[-6] == (MessageOptions)0x200) {
            local_80._0_4_ = 7;
            iVar22._M_current =
                 (pvVar23->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_80._8_4_ = uVar8;
            local_80._12_4_ = uVar10;
            if (iVar22._M_current ==
                (pvVar23->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                        (pvVar23,iVar22,(AuxEntry *)local_80);
            }
            else {
LAB_0043079e:
              aVar7.enum_range.last = local_80._12_4_;
              aVar7.offset = local_80._8_4_;
              *(undefined8 *)iVar22._M_current = local_80._0_8_;
              (iVar22._M_current)->field_1 = aVar7;
              ppAVar1 = &(pvVar23->
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          else {
            local_80._0_8_ = (ulong)(uint)local_80._4_4_ << 0x20;
            local_80._8_4_ = 0;
            local_80._12_4_ = 0;
            iVar22._M_current =
                 (pvVar23->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar22._M_current !=
                (pvVar23->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043079e;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (pvVar23,iVar22,(AuxEntry *)local_80);
          }
        }
        else {
          pFVar24[-1].aux_idx = 0xffff;
        }
      }
      else {
        uVar16 = 6;
        if (((pMVar27[-5].uses_codegen != false) || (uVar16 = 4, pMVar27[-4].is_lite != true)) ||
           (uVar16 = 5, *(float *)(pMVar27 + -8) < 0.005)) {
          iVar22._M_current =
               (local_68->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pFVar24[-1].aux_idx =
               (uint16_t)
               ((uint)((int)iVar22._M_current -
                      *(int *)&(local_68->
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_80._0_4_ = uVar16;
          if (iVar22._M_current ==
              (local_68->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80._8_4_ = uVar8;
            local_80._12_4_ = uVar10;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_68,iVar22,(AuxEntry *)local_80);
          }
          else {
            *(undefined8 *)iVar22._M_current = local_80._0_8_;
            ((iVar22._M_current)->field_1).field = pFVar19;
            ppAVar1 = &(local_68->
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
            local_80._8_4_ = uVar8;
            local_80._12_4_ = uVar10;
          }
        }
        else {
          pAVar20 = (local_68->
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pAVar20[local_60].type = kSubTable;
          pAVar20[local_60].field_1.field = pFVar19;
          pFVar24[-1].aux_idx = (uint16_t)local_60;
          local_60 = local_60 + 1;
        }
      }
    }
  }
  else {
    if (uVar3 == '\x0e') {
      bVar11 = anon_unknown_36::TreatEnumAsInt(pFVar19);
      pvVar23 = local_68;
      if (!bVar11) {
        iVar22._M_current =
             (local_68->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        pFVar24[-1].aux_idx =
             (uint16_t)
             ((uint)((int)iVar22._M_current -
                    *(int *)&(local_68->
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4);
        local_80._0_8_ = local_80._0_8_ & 0xffffffff00000000;
        local_80._8_4_ = 0;
        local_80._12_4_ = 0;
        if (iVar22._M_current ==
            (local_68->
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                    (local_68,iVar22,(AuxEntry *)local_80);
          pAVar20 = (pvVar23->
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *(undefined8 *)iVar22._M_current = local_80._0_8_;
          ((iVar22._M_current)->field_1).field = (FieldDescriptor *)0x0;
          pAVar20 = (local_68->
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    )._M_impl.super__Vector_impl_data._M_finish + 1;
          (local_68->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          )._M_impl.super__Vector_impl_data._M_finish = pAVar20;
        }
        pEVar17 = FieldDescriptor::enum_type(pFVar19);
        bVar11 = anon_unknown_36::GetEnumValidationRange
                           (pEVar17,(int32_t *)&pAVar20[-1].field_1.offset,
                            &pAVar20[-1].field_1.enum_range.last);
        if (bVar11) {
          pAVar20[-1].type = kEnumRange;
        }
        else {
          pAVar20[-1].type = kEnumValidator;
          pAVar20[-1].field_1.field = pFVar19;
        }
        goto LAB_004307ab;
      }
      uVar3 = pFVar19->type_;
    }
    else if (uVar3 == '\v') {
      bVar11 = FieldDescriptor::is_map_message_type(pFVar19);
      pvVar23 = local_68;
      if (!bVar11) goto LAB_00430434;
      iVar22._M_current =
           (local_68->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pFVar24[-1].aux_idx =
           (uint16_t)
           ((uint)((int)iVar22._M_current -
                  *(int *)&(local_68->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_80._0_4_ = 0xc;
      if (iVar22._M_current ==
          (local_68->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_80._8_4_ = uVar8;
        local_80._12_4_ = uVar10;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                  (local_68,iVar22,(AuxEntry *)local_80);
      }
      else {
        *(undefined8 *)iVar22._M_current = local_80._0_8_;
        ((iVar22._M_current)->field_1).field = pFVar19;
        ppAVar1 = &(local_68->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
        local_80._8_4_ = uVar8;
        local_80._12_4_ = uVar10;
      }
      if (local_50->field_0x1 == '\x01') {
        pDVar18 = FieldDescriptor::message_type(pFVar19);
        pFVar19 = Descriptor::map_value(pDVar18);
        pDVar18 = FieldDescriptor::message_type(pFVar19);
        uVar8 = local_80._12_4_;
        uVar16 = local_80._8_4_;
        local_80._8_4_ = SUB84(pFVar19,0);
        uVar9 = local_80._8_4_;
        local_80._12_4_ = (undefined4)((ulong)pFVar19 >> 0x20);
        uVar10 = local_80._12_4_;
        if (pDVar18 == (Descriptor *)0x0) {
          local_80._8_4_ = uVar16;
          local_80._12_4_ = uVar8;
          if ((pFVar19->type_ == '\x0e') &&
             (bVar11 = cpp::HasPreservingUnknownEnumSemantics(pFVar19), !bVar11)) {
            local_80._0_4_ = 10;
            iVar22._M_current =
                 (pvVar23->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_80._8_4_ = uVar9;
            local_80._12_4_ = uVar10;
            if (iVar22._M_current !=
                (pvVar23->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043079e;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (pvVar23,iVar22,(AuxEntry *)local_80);
          }
        }
        else {
          local_80._0_4_ = 5;
          iVar22._M_current =
               (pvVar23->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_80._8_4_ = uVar9;
          local_80._12_4_ = uVar10;
          if (iVar22._M_current !=
              (pvVar23->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043079e;
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                    (pvVar23,iVar22,(AuxEntry *)local_80);
        }
      }
      goto LAB_004307ab;
    }
    pvVar23 = local_68;
    if (((uVar3 == '\f') || (uVar3 == '\t')) && (pMVar27[-5].is_lite == true)) {
      bVar2 = pFVar19->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 != bVar11) {
        pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar21);
        goto LAB_00430c39;
      }
      if ((bVar2 & 0x20) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x380,"!field->is_repeated()");
        goto LAB_00430c39;
      }
      uVar5 = *(uint32_t *)(pMVar27 + -2);
      iVar22._M_current =
           (local_68->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pFVar24[-1].aux_idx =
           (uint16_t)
           ((uint)((int)iVar22._M_current -
                  *(int *)&(local_68->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_80._0_4_ = 0xb;
      local_80._8_4_ = 0;
      local_80._12_4_ = 0;
      if (iVar22._M_current ==
          (local_68->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                  (local_68,iVar22,(AuxEntry *)local_80);
        pAVar20 = (pvVar23->
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *(undefined8 *)iVar22._M_current = local_80._0_8_;
        ((iVar22._M_current)->field_1).field = (FieldDescriptor *)0x0;
        pAVar20 = (local_68->
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                  )._M_impl.super__Vector_impl_data._M_finish + 1;
        (local_68->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        )._M_impl.super__Vector_impl_data._M_finish = pAVar20;
      }
      pAVar20[-1].field_1.offset = uVar5;
      pFVar24[-1].inlined_string_idx = uVar5;
    }
  }
LAB_004307ab:
  pMVar25 = pMVar27 + 2;
  pMVar27 = pMVar27 + 0x10;
  if (pMVar25 == local_48) goto LAB_00430826;
  goto LAB_0042fdbe;
}

Assistant:

std::vector<TailCallTableInfo::FieldEntryInfo>
TailCallTableInfo::BuildFieldEntries(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields,
    std::vector<TailCallTableInfo::AuxEntry>& aux_entries) {
  std::vector<FieldEntryInfo> field_entries;
  field_entries.reserve(ordered_fields.size());

  const auto is_non_cold = [](const FieldOptions& options) {
    return options.presence_probability >= 0.005;
  };
  size_t num_non_cold_subtables = 0;
  // We found that clustering non-cold subtables to the top of aux_entries
  // achieves the best load tests results than other strategies (e.g.,
  // clustering all non-cold entries).
  const auto is_non_cold_subtable = [&](const FieldOptions& options) {
    auto* field = options.field;
    // In the following code where we assign kSubTable to aux entries, only
    // the following typed fields are supported.
    return (field->type() == FieldDescriptor::TYPE_MESSAGE ||
            field->type() == FieldDescriptor::TYPE_GROUP) &&
           !field->is_map() && !field->options().weak() &&
           !HasLazyRep(field, options) && !options.is_implicitly_weak &&
           options.use_direct_tcparser_table && is_non_cold(options);
  };
  for (const FieldOptions& options : ordered_fields) {
    if (is_non_cold_subtable(options)) {
      num_non_cold_subtables++;
    }
  }

  size_t subtable_aux_idx_begin = aux_entries.size();
  size_t subtable_aux_idx = aux_entries.size();
  aux_entries.resize(aux_entries.size() + num_non_cold_subtables);

  // Fill in mini table entries.
  for (const auto& options : ordered_fields) {
    auto* field = options.field;
    field_entries.push_back({field, options.has_bit_index});
    auto& entry = field_entries.back();
    entry.utf8_check_mode =
        cpp::GetUtf8CheckMode(field, message_options.is_lite);
    entry.type_card = MakeTypeCardForField(field, entry.hasbit_idx >= 0,
                                           options, entry.utf8_check_mode);

    if (field->type() == FieldDescriptor::TYPE_MESSAGE ||
        field->type() == FieldDescriptor::TYPE_GROUP) {
      // Message-typed fields have a FieldAux with the default instance pointer.
      if (field->is_map()) {
        entry.aux_idx = aux_entries.size();
        aux_entries.push_back({kMapAuxInfo, {field}});
        if (message_options.uses_codegen) {
          // If we don't use codegen we can't add these.
          auto* map_value = field->message_type()->map_value();
          if (map_value->message_type() != nullptr) {
            aux_entries.push_back({kSubTable, {map_value}});
          } else if (map_value->type() == FieldDescriptor::TYPE_ENUM &&
                     !cpp::HasPreservingUnknownEnumSemantics(map_value)) {
            aux_entries.push_back({kEnumValidator, {map_value}});
          }
        }
      } else if (field->options().weak()) {
        // Disable the type card for this entry to force the fallback.
        entry.type_card = 0;
      } else if (HasLazyRep(field, options)) {
        if (message_options.uses_codegen) {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({kSubMessage, {field}});
          if (options.lazy_opt == field_layout::kTvEager) {
            aux_entries.push_back({kMessageVerifyFunc, {field}});
          } else {
            aux_entries.push_back({kNothing});
          }
        } else {
          entry.aux_idx = TcParseTableBase::FieldEntry::kNoAuxIdx;
        }
      } else {
        AuxType type = options.is_implicitly_weak          ? kSubMessageWeak
                       : options.use_direct_tcparser_table ? kSubTable
                                                           : kSubMessage;
        if (type == kSubTable && is_non_cold(options)) {
          aux_entries[subtable_aux_idx] = {type, {field}};
          entry.aux_idx = subtable_aux_idx;
          ++subtable_aux_idx;
        } else {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({type, {field}});
        }
      }
    } else if (field->type() == FieldDescriptor::TYPE_ENUM &&
               !TreatEnumAsInt(field)) {
      // Enum fields which preserve unknown values (proto3 behavior) are
      // effectively int32 fields with respect to parsing -- i.e., the value
      // does not need to be validated at parse time.
      //
      // Enum fields which do not preserve unknown values (proto2 behavior) use
      // a FieldAux to store validation information. If the enum values are
      // sequential (and within a range we can represent), then the FieldAux
      // entry represents the range using the minimum value (which must fit in
      // an int16_t) and count (a uint16_t). Otherwise, the entry holds a
      // pointer to the generated Name_IsValid function.

      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({});
      auto& aux_entry = aux_entries.back();

      if (GetEnumValidationRange(field->enum_type(), aux_entry.enum_range.first,
                                 aux_entry.enum_range.last)) {
        aux_entry.type = kEnumRange;
      } else {
        aux_entry.type = kEnumValidator;
        aux_entry.field = field;
      }

    } else if ((field->type() == FieldDescriptor::TYPE_STRING ||
                field->type() == FieldDescriptor::TYPE_BYTES) &&
               options.is_string_inlined) {
      ABSL_CHECK(!field->is_repeated());
      // Inlined strings have an extra marker to represent their donation state.
      int idx = options.inlined_string_index;
      // For mini parsing, the donation state index is stored as an `offset`
      // auxiliary entry.
      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({kNumericOffset});
      aux_entries.back().offset = idx;
      // For fast table parsing, the donation state index is stored instead of
      // the aux_idx (this will limit the range to 8 bits).
      entry.inlined_string_idx = idx;
    }
  }
  ABSL_CHECK_EQ(subtable_aux_idx - subtable_aux_idx_begin,
                num_non_cold_subtables);

  return field_entries;
}